

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Test(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  char *pcVar8;
  uint local_3c;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  local_3c = 1000;
  uVar6 = 5;
  bVar1 = false;
LAB_0029409e:
  while (iVar4 = Extra_UtilGetopt(argc,argv,"WPFsvh"), iVar3 = globalUtilOptind, iVar4 == 0x50) {
    if (argc <= globalUtilOptind) {
      pcVar7 = "Command line switch \"-P\" should be followed by an integer.\n";
      goto LAB_00294161;
    }
    uVar5 = atoi(argv[globalUtilOptind]);
joined_r0x00294137:
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar5 < 0) {
LAB_0029416d:
      Abc_Print(-2,"usage: &test [-FW num] [-svh]\n");
      Abc_Print(-2,"\t        testing various procedures\n");
      Abc_Print(-2,"\t-F num: the number of timeframes [default = %d]\n",(ulong)uVar6);
      Abc_Print(-2,"\t-W num: the number of machine words [default = %d]\n",(ulong)local_3c);
      pcVar8 = "yes";
      pcVar7 = "yes";
      if (!bVar1) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-s    : toggle enable (yes) vs. disable (no) [default = %s]\n",pcVar7);
      if (!bVar2) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v    : toggle printing verbose information [default = %s]\n",pcVar8);
      Abc_Print(-2,"\t-h    : print the command usage\n");
      return 1;
    }
  }
  if (iVar4 < 0x57) {
    if (iVar4 == -1) {
      return 0;
    }
    if (iVar4 != 0x46) goto LAB_0029416d;
    if (globalUtilOptind < argc) {
      uVar6 = atoi(argv[globalUtilOptind]);
      uVar5 = uVar6;
      goto joined_r0x00294137;
    }
    pcVar7 = "Command line switch \"-F\" should be followed by an integer.\n";
  }
  else {
    if (iVar4 == 0x76) {
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_0029409e;
    }
    if (iVar4 == 0x73) {
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_0029409e;
    }
    if (iVar4 != 0x57) goto LAB_0029416d;
    if (globalUtilOptind < argc) {
      local_3c = atoi(argv[globalUtilOptind]);
      uVar5 = local_3c;
      goto joined_r0x00294137;
    }
    pcVar7 = "Command line switch \"-W\" should be followed by an integer.\n";
  }
LAB_00294161:
  Abc_Print(-1,pcVar7);
  goto LAB_0029416d;
}

Assistant:

int Abc_CommandAbc9Test( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fVerbose = 0;
    int nFrames = 5;
    int fSwitch = 0;
    int nWords = 1000;
    int nProcs = 2;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WPFsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nProcs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nProcs < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 's':
            fSwitch ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
//    if ( pAbc->pGia == NULL )
//    {
//        Abc_Print( -1, "Abc_CommandAbc9Test(): There is no AIG.\n" );
//        return 1;
//    }
//    Abc_FrameUpdateGia( pAbc, Abc_Procedure(pAbc->pGia) );
//    Gia_ManTryResub( pAbc->pGia );
    return 0;
usage:
    Abc_Print( -2, "usage: &test [-FW num] [-svh]\n" );
    Abc_Print( -2, "\t        testing various procedures\n" );
    Abc_Print( -2, "\t-F num: the number of timeframes [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-W num: the number of machine words [default = %d]\n", nWords );
    Abc_Print( -2, "\t-s    : toggle enable (yes) vs. disable (no) [default = %s]\n", fSwitch? "yes": "no" );
    Abc_Print( -2, "\t-v    : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}